

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extractor.cpp
# Opt level: O0

void __thiscall Extractor::setFile(Extractor *this,char *file_name)

{
  FILE *pFVar1;
  runtime_error *this_00;
  allocator local_79;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  char *local_18;
  char *file_name_local;
  Extractor *this_local;
  
  local_18 = file_name;
  file_name_local = (char *)this;
  if (this->_file != (FILE *)0x0) {
    _free(this,file_name);
  }
  std::__cxx11::string::operator=((string *)&this->_file_name,local_18);
  pFVar1 = fopen(local_18,"rb");
  this->_file = (FILE *)pFVar1;
  if (this->_file == (FILE *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"unable to open file (",&local_79);
    std::operator+(local_58,(char *)local_78);
    std::operator+(local_38,(char *)local_58);
    std::runtime_error::runtime_error(this_00,(string *)local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Extractor::setFile(const char *file_name)
{
	if (_file) {
		_free();
	}
	_file_name = file_name;
	_file = fopen(file_name, "rb");
	if (!_file) {
		throw std::runtime_error(std::string("unable to open file (") + file_name + ")");
	}
}